

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_el_hahn.cpp
# Opt level: O3

void __thiscall
PP_el_hahn::monochromaticDiffusion
          (PP_el_hahn *this,double mx0,double my0,double mz0,double dw,bool rotFrame)

{
  C_matrix<double> *this_00;
  C_matrix<double> *this_01;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *pdVar7;
  ostream *poVar8;
  double *pdVar9;
  undefined7 in_register_00000031;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  undefined1 local_48 [16];
  
  dVar5 = (this->super_PP_sigRMN).Bz0;
  dVar6 = (this->super_PP_sigRMN).Bxy;
  dVar1 = (this->super_PP_sigRMN).muz0;
  dVar12 = (this->super_PP_sigRMN).T1;
  dVar2 = (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).muz0 = (dw / (dVar5 * dVar2) + 1.0) * dVar1;
  (this->super_PP_sigRMN).Bz0 = dw / dVar2 + dVar5;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  dVar2 = (this->super_PP_sigRMN).T2;
  if (dVar12 <= dVar2) {
    dVar12 = dVar2;
  }
  (this->super_PP_sigRMN).sigLength = 200;
  dVar10 = PP_sigRMN::generateFIDsignalWithDiffusion
                     (&this->super_PP_sigRMN,mx0,my0,mz0,dVar12 / 200.0,dw);
  dVar10 = dVar10 + 0.0;
  this_00 = &(this->super_PP_sigRMN).MU;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar12 = *pdVar7;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar2 = *pdVar7;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar3 = *pdVar7;
  if ((int)CONCAT71(in_register_00000031,rotFrame) == 0) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar10);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"initSig.txt","");
  C_matrix<double>::save(this_00,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  this_01 = &(this->super_PP_sigRMN).T;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"initSigTime.txt","");
  C_matrix<double>::save(this_01,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  poVar8 = std::ostream::_M_insert<double>(dVar10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  dVar11 = (this->super_PP_sigRMN).gamma;
  dVar13 = dw / dVar11 + dVar5;
  (this->super_PP_sigRMN).Bz0 = dVar13;
  (this->super_PP_sigRMN).Bxy = dVar6;
  (this->super_PP_sigRMN).omega = dVar13 * dVar11;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar11 = PP_sigRMN::generateRMNsignal
                     (&this->super_PP_sigRMN,dVar12,dVar2,dVar3,(this->super_PP_sigRMN).tw / 4000.0,
                      dw);
  dVar11 = dVar11 + dVar10;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar12 = *pdVar7;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar2 = *pdVar7;
  pdVar7 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar3 = *pdVar7;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar11);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"p90.txt","");
  C_matrix<double>::save(this_00,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"p90Time.txt","");
  C_matrix<double>::save(this_01,&local_c8);
  pdVar7 = &(this->super_PP_sigRMN).Bxy;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  poVar8 = std::ostream::_M_insert<double>(dVar11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  (this->super_PP_sigRMN).Bz0 = dw / (this->super_PP_sigRMN).gamma + dVar5;
  *pdVar7 = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar10 = PP_sigRMN::generateFIDsignalWithDiffusion
                     (&this->super_PP_sigRMN,dVar12,dVar2,dVar3,
                      ((this->super_PP_sigRMN).TE * 0.5 - (this->super_PP_sigRMN).tw) / 4000.0,dw);
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar12 = *pdVar9;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar2 = *pdVar9;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar3 = *pdVar9;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar10 + dVar11);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"fid.txt","");
  C_matrix<double>::save(this_00,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"fidTime.txt","");
  C_matrix<double>::save(this_01,&local_108);
  uVar16 = (undefined4)((ulong)dVar6 >> 0x20);
  uVar15 = SUB84(dVar6,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    local_48._8_4_ = SUB84(dVar6,0);
    local_48._0_8_ = dVar6;
    local_48._12_4_ = uVar16;
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    uVar15 = local_48._0_4_;
    uVar16 = local_48._4_4_;
  }
  dVar13 = (this->super_PP_sigRMN).gamma;
  dVar4 = (this->super_PP_sigRMN).tw;
  dVar14 = dw / dVar13 + dVar5;
  (this->super_PP_sigRMN).Bz0 = dVar14;
  (this->super_PP_sigRMN).Bxy = (double)CONCAT44(uVar16,uVar15);
  (this->super_PP_sigRMN).omega = dVar14 * dVar13;
  (this->super_PP_sigRMN).sigLength = 4000;
  dVar13 = PP_sigRMN::generateRMNsignal
                     (&this->super_PP_sigRMN,dVar12,dVar2,dVar3,(dVar4 + dVar4) / 4000.0,dw);
  dVar13 = dVar10 + dVar11 + dVar13;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,0);
  dVar12 = *pdVar9;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,1);
  dVar2 = *pdVar9;
  pdVar9 = C_matrix<double>::operator()(this_00,(this->super_PP_sigRMN).MU.endL,2);
  dVar3 = *pdVar9;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar13);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"p180.txt","");
  C_matrix<double>::save(this_00,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"p180Time.txt","");
  C_matrix<double>::save(this_01,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  poVar8 = std::ostream::_M_insert<double>(dVar13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  (this->super_PP_sigRMN).Bz0 = dw / (this->super_PP_sigRMN).gamma + dVar5;
  *pdVar7 = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 2000;
  dVar12 = PP_sigRMN::generateFIDsignalWithDiffusion
                     (&this->super_PP_sigRMN,dVar12,dVar2,dVar3,
                      ((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) / 2000.0,dw);
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,dVar13 + dVar12);
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"spinEcho.txt","");
  C_matrix<double>::save(this_00,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"spinEchoTime.txt","");
  C_matrix<double>::save(this_01,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  (this->super_PP_sigRMN).Bz0 = dVar5;
  (this->super_PP_sigRMN).Bxy = dVar6;
  (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * dVar5;
  (this->super_PP_sigRMN).muz0 = dVar1;
  return;
}

Assistant:

void PP_el_hahn::monochromaticDiffusion(double mx0, double my0, double mz0, double dw, bool rotFrame)
{
    //the perturbating magnetic field pulsation is gamma*Bz0, but the actual constant field is Bz0+(dw/gamma)
    double dt;
    double tmpBz0 = Bz0;
    double tmpBxy = Bxy;
    double tmpX=mx0, tmpY=my0, tmpZ=mz0;
    double tempMuz0=muz0;
    muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));

    /******************************************************/
    /** initialization */
    //apply the constant magnetic field during t0
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    double t0=MAX(T1,T2);
    sigLength=200;
    dt=t0/((double) sigLength);
    double t00=0.0;

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("initSig.txt");
    T.save("initSigTime.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** first pulse */
    //play one pi/2-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    //t90 = Pi/(2.0*gamma*Bxy);
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("p90.txt");
    T.save("p90Time.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** free induction decay */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=(0.5*TE - tw)/((double) sigLength);
    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("fid.txt");
    T.save("fidTime.txt");



    /******************************************************/
    /** second pulse */
    //play the pi-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=2.0*tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MU.save("p180.txt");
    T.save("p180Time.txt");
    std::cout << t00 << std::endl;


    /******************************************************/
    /** spin echo */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=2000;
    dt=(TE-tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    if(!rotFrame) frameToFix(t00);
    MU.save("spinEcho.txt");
    T.save("spinEchoTime.txt");

    //restore the parameters
    Bz0=tmpBz0;
    Bxy=tmpBxy; omega=gamma*Bz0;
    muz0=tempMuz0;
    return;
    return;
}